

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.hpp
# Opt level: O0

void __thiscall
qclab::qgates::Hadamard<std::complex<float>_>::Hadamard
          (Hadamard<std::complex<float>_> *this,int qubit)

{
  int qubit_local;
  Hadamard<std::complex<float>_> *this_local;
  
  QGate1<std::complex<float>_>::QGate1(&this->super_QGate1<std::complex<float>_>,qubit);
  (this->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_0014e058;
  return;
}

Assistant:

QGate1( const int qubit )
        : qubit_( qubit )
        {
          assert( qubit >= 0 ) ;
        }